

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O2

void printKVData(ktx_uint8_t *pKvd,ktx_uint32_t kvdLen)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  _Bool _Var5;
  ktx_error_code_e kVar6;
  int iVar7;
  ktxHashList This;
  char *pcVar8;
  char *pcVar9;
  uint uVar10;
  ulong uVar11;
  size_t sStack_60;
  ktx_uint32_t valueLen;
  ktx_uint32_t keyLen;
  ktxHashList kvDataHead;
  char *value;
  char *key;
  
  kvDataHead = (ktxHashList)0x0;
  if ((pKvd == (ktx_uint8_t *)0x0) || (kvdLen == 0)) {
    __assert_fail("pKvd != NULL && kvdLen > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/info.c"
                  ,0x8b,"void printKVData(ktx_uint8_t *, ktx_uint32_t)");
  }
  kVar6 = ktxHashList_Deserialize(&kvDataHead,kvdLen,pKvd);
  if (kVar6 == KTX_SUCCESS) {
    if (kvDataHead != (ktxHashList)0x0) {
      This = kvDataHead;
      for (uVar10 = 0; (This != (ktxHashListEntry *)0x0 && (uVar10 < 100)); uVar10 = uVar10 + 1) {
        ktxHashListEntry_GetKey(This,&keyLen,&key);
        ktxHashListEntry_GetValue(This,&valueLen,&value);
        fprintf(_stdout,"%s:",key);
        pcVar9 = key;
        pcVar8 = value;
        if (value == (char *)0x0) {
          pcVar8 = " null\n";
          sStack_60 = 6;
LAB_001b8570:
          fwrite(pcVar8,sStack_60,1,_stdout);
        }
        else {
          iVar7 = strcmp(key,"KTXglFormat");
          if (iVar7 == 0) {
            if (valueLen == 0xc) {
              uVar3 = *(uint *)pcVar8;
              uVar4 = *(uint *)(pcVar8 + 4);
              uVar2 = *(uint *)(pcVar8 + 8);
              fputc(10,_stdout);
              fprintf(_stdout,"    glInternalformat: 0x%08X\n",(ulong)uVar3);
              fprintf(_stdout,"    glFormat: 0x%08X\n",(ulong)uVar4);
              pcVar8 = "    glType: 0x%08X\n";
LAB_001b85d9:
              fprintf(_stdout,pcVar8,(ulong)uVar2);
            }
          }
          else {
            iVar7 = strcmp(pcVar9,"KTXanimData");
            if (iVar7 == 0) {
              if (valueLen == 0xc) {
                uVar3 = *(uint *)pcVar8;
                uVar4 = *(uint *)(pcVar8 + 4);
                uVar2 = *(uint *)(pcVar8 + 8);
                fputc(10,_stdout);
                fprintf(_stdout,"    duration: %u\n",(ulong)uVar3);
                fprintf(_stdout,"    timescale: %u\n",(ulong)uVar4);
                pcVar8 = "";
                if (uVar2 == 0) {
                  pcVar8 = " (infinite)";
                }
                fprintf(_stdout,"    loopCount: %u%s\n",(ulong)uVar2,pcVar8);
              }
            }
            else {
              iVar7 = strcmp(pcVar9,"KTXcubemapIncomplete");
              if (iVar7 == 0) {
                if (valueLen == 1) {
                  bVar1 = *pcVar8;
                  fputc(10,_stdout);
                  pcVar8 = "true";
                  if ((bVar1 & 1) == 0) {
                    pcVar8 = "false";
                  }
                  fprintf(_stdout,"    positiveX: %s\n",pcVar8);
                  pcVar8 = "true";
                  if ((bVar1 & 2) == 0) {
                    pcVar8 = "false";
                  }
                  fprintf(_stdout,"    negativeX: %s\n",pcVar8);
                  pcVar8 = "true";
                  if ((bVar1 & 4) == 0) {
                    pcVar8 = "false";
                  }
                  fprintf(_stdout,"    positiveY: %s\n",pcVar8);
                  pcVar8 = "true";
                  if ((bVar1 & 8) == 0) {
                    pcVar8 = "false";
                  }
                  fprintf(_stdout,"    negativeY: %s\n",pcVar8);
                  pcVar8 = "true";
                  if ((bVar1 & 0x10) == 0) {
                    pcVar8 = "false";
                  }
                  fprintf(_stdout,"    positiveZ: %s\n",pcVar8);
                  pcVar8 = "true";
                  if ((bVar1 & 0x20) == 0) {
                    pcVar8 = "false";
                  }
                  pcVar9 = "    negativeZ: %s\n";
LAB_001b877f:
                  fprintf(_stdout,pcVar9,pcVar8);
                }
              }
              else {
                _Var5 = isKnownKeyValueUINT32(pcVar9);
                if (_Var5) {
                  if (valueLen == 4) {
                    uVar2 = *(uint *)pcVar8;
                    pcVar8 = " %u\n";
                    goto LAB_001b85d9;
                  }
                }
                else {
                  _Var5 = isKnownKeyValueString(pcVar9);
                  if (!_Var5) {
                    fwrite(" [",2,1,_stdout);
                    uVar11 = 0;
                    while( true ) {
                      if (valueLen <= uVar11) break;
                      pcVar8 = value + uVar11;
                      uVar11 = uVar11 + 1;
                      pcVar9 = ", ";
                      if (uVar11 == valueLen) {
                        pcVar9 = "";
                      }
                      fprintf(_stdout,"%d%s",(ulong)(uint)(int)*pcVar8,pcVar9);
                    }
                    pcVar8 = "]\n";
                    sStack_60 = 2;
                    goto LAB_001b8570;
                  }
                  if (pcVar8[valueLen - 1] == '\0') {
                    pcVar9 = " %s\n";
                    goto LAB_001b877f;
                  }
                }
              }
            }
          }
        }
        This = ktxHashList_Next(This);
      }
      ktxHashList_Destruct(&kvDataHead);
    }
  }
  else {
    fwrite("Failed to parse or not enough memory to build list of key/value pairs.\n",0x47,1,_stdout
          );
  }
  return;
}

Assistant:

void
printKVData(ktx_uint8_t* pKvd, ktx_uint32_t kvdLen)
{
    KTX_error_code result;
    ktxHashList kvDataHead = 0;

    assert(pKvd != NULL && kvdLen > 0);

    result = ktxHashList_Deserialize(&kvDataHead, kvdLen, pKvd);
    if (result != KTX_SUCCESS) {
        fprintf(stdout, "Failed to parse or not enough memory to build list of key/value pairs.\n");
        return;
    }

    if (kvDataHead == NULL)
        return;

    int entryIndex = 0;
    ktxHashListEntry* entry = kvDataHead;
    for (; entry != NULL && entryIndex < MAX_NUM_KVD_ENTRIES; entry = ktxHashList_Next(entry), ++entryIndex) {
        char* key;
        char* value;
        ktx_uint32_t keyLen, valueLen;

        ktxHashListEntry_GetKey(entry, &keyLen, &key);
        ktxHashListEntry_GetValue(entry, &valueLen, (void**)&value);
        // Keys must be NUL terminated.
        fprintf(stdout, "%s:", key);
        if (!value) {
            fprintf(stdout, " null\n");

        } else {
            if (strcmp(key, "KTXglFormat") == 0) {
                if (valueLen == 3 * sizeof(ktx_uint32_t)) {
                    ktx_uint32_t glInternalformat = *(const ktx_uint32_t*) (value + 0);
                    ktx_uint32_t glFormat = *(const ktx_uint32_t*) (value + 4);
                    ktx_uint32_t glType = *(const ktx_uint32_t*) (value + 8);
                    fprintf(stdout, "\n");
                    fprintf(stdout, "    glInternalformat: 0x%08X\n", glInternalformat);
                    fprintf(stdout, "    glFormat: 0x%08X\n", glFormat);
                    fprintf(stdout, "    glType: 0x%08X\n", glType);
                }

            } else if (strcmp(key, "KTXanimData") == 0) {
                if (valueLen == 3 * sizeof(ktx_uint32_t)) {
                    ktx_uint32_t duration = *(const ktx_uint32_t*) (value + 0);
                    ktx_uint32_t timescale = *(const ktx_uint32_t*) (value + 4);
                    ktx_uint32_t loopCount = *(const ktx_uint32_t*) (value + 8);
                    fprintf(stdout, "\n");
                    fprintf(stdout, "    duration: %u\n", duration);
                    fprintf(stdout, "    timescale: %u\n", timescale);
                    fprintf(stdout, "    loopCount: %u%s\n", loopCount, loopCount == 0 ? " (infinite)" : "");
                }

            } else if (strcmp(key, "KTXcubemapIncomplete") == 0) {
                if (valueLen == sizeof(ktx_uint8_t)) {
                    ktx_uint8_t faces = *value;
                    fprintf(stdout, "\n");
                    fprintf(stdout, "    positiveX: %s\n", faces & 1u << 0u ? "true" : "false");
                    fprintf(stdout, "    negativeX: %s\n", faces & 1u << 1u ? "true" : "false");
                    fprintf(stdout, "    positiveY: %s\n", faces & 1u << 2u ? "true" : "false");
                    fprintf(stdout, "    negativeY: %s\n", faces & 1u << 3u ? "true" : "false");
                    fprintf(stdout, "    positiveZ: %s\n", faces & 1u << 4u ? "true" : "false");
                    fprintf(stdout, "    negativeZ: %s\n", faces & 1u << 5u ? "true" : "false");
                }

            } else if (isKnownKeyValueUINT32(key)) {
                if (valueLen == sizeof(ktx_uint32_t)) {
                    ktx_uint32_t number = *(const ktx_uint32_t*) value;
                    fprintf(stdout, " %u\n", number);
                }

            } else if (isKnownKeyValueString(key)) {
                if (value[valueLen-1] == '\0') {
                    fprintf(stdout, " %s\n", value);
                }

            } else {
                fprintf(stdout, " [");
                for (ktx_uint32_t i = 0; i < valueLen; i++)
                    fprintf(stdout, "%d%s", (int) value[i], i + 1 == valueLen ? "" : ", ");
                fprintf(stdout, "]\n");
            }
        }
    }

    ktxHashList_Destruct(&kvDataHead);
}